

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O3

void PrintBlock(InstructionVMGraphContext *ctx,VmBlock *block)

{
  VmInstructionType VVar1;
  VmBlock *pVVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  VmValue *pVVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  VmInstruction *pVVar10;
  
  PrintUsers(ctx,&block->super_VmValue,false);
  pcVar5 = (block->name).begin;
  PrintLine(ctx,"%.*s.b%d:",(ulong)(uint)(*(int *)&(block->name).end - (int)pcVar5),pcVar5,
            (ulong)block->uniqueId);
  ctx->depth = ctx->depth + 1;
  Print(ctx,"  // predecessor blocks: [");
  if ((block->predecessors).count != 0) {
    uVar8 = 0;
    do {
      pVVar2 = (block->predecessors).data[uVar8];
      if (uVar8 != 0) {
        Print(ctx,", ");
      }
      pcVar5 = (pVVar2->name).begin;
      Print(ctx,"\'%.*s.b%d\'",(ulong)(uint)(*(int *)&(pVVar2->name).end - (int)pcVar5),pcVar5,
            (ulong)pVVar2->uniqueId);
      uVar8 = uVar8 + 1;
    } while (uVar8 < (block->predecessors).count);
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // successor blocks: [");
  if ((block->successors).count != 0) {
    uVar8 = 0;
    do {
      pVVar2 = (block->successors).data[uVar8];
      if (uVar8 != 0) {
        Print(ctx,", ");
      }
      pcVar5 = (pVVar2->name).begin;
      Print(ctx,"\'%.*s.b%d\'",(ulong)(uint)(*(int *)&(pVVar2->name).end - (int)pcVar5),pcVar5,
            (ulong)pVVar2->uniqueId);
      uVar8 = uVar8 + 1;
    } while (uVar8 < (block->successors).count);
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // immediate dominator: [");
  pVVar2 = block->idom;
  if (pVVar2 != (VmBlock *)0x0) {
    pcVar5 = (pVVar2->name).begin;
    Print(ctx,"\'%.*s.b%d\'",(ulong)(uint)(*(int *)&(pVVar2->name).end - (int)pcVar5),pcVar5,
          (ulong)pVVar2->uniqueId);
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // dominance frontier: [");
  if ((block->dominanceFrontier).count != 0) {
    uVar8 = 0;
    do {
      pVVar2 = (block->dominanceFrontier).data[uVar8];
      if (uVar8 != 0) {
        Print(ctx,", ");
      }
      pcVar5 = (pVVar2->name).begin;
      Print(ctx,"\'%.*s.b%d\'",(ulong)(uint)(*(int *)&(pVVar2->name).end - (int)pcVar5),pcVar5,
            (ulong)pVVar2->uniqueId);
      uVar8 = uVar8 + 1;
    } while (uVar8 < (block->dominanceFrontier).count);
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // dominance children: [");
  if ((block->dominanceChildren).count != 0) {
    uVar8 = 0;
    do {
      pVVar2 = (block->dominanceChildren).data[uVar8];
      if (uVar8 != 0) {
        Print(ctx,", ");
      }
      pcVar5 = (pVVar2->name).begin;
      Print(ctx,"\'%.*s.b%d\'",(ulong)(uint)(*(int *)&(pVVar2->name).end - (int)pcVar5),pcVar5,
            (ulong)pVVar2->uniqueId);
      uVar8 = uVar8 + 1;
    } while (uVar8 < (block->dominanceChildren).count);
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // live variables going in: [");
  if ((block->liveIn).count != 0) {
    uVar8 = 0;
    do {
      pVVar10 = (block->liveIn).data[uVar8];
      if (uVar8 != 0) {
        Print(ctx,", ");
      }
      VVar1 = pVVar10->cmd;
      Print(ctx,"%%%d",(ulong)pVVar10->uniqueId);
      if (VVar1 == VM_INST_PHI) {
        if (pVVar10->color != 0) {
          Print(ctx,".c%d");
        }
        if ((pVVar10->regVmRegisters).count != 0) {
          Print(ctx,".r");
          if ((pVVar10->regVmRegisters).count != 0) {
            uVar9 = 0;
            do {
              pcVar5 = "|%d";
              if (uVar9 == 0) {
                pcVar5 = "%d";
              }
              Print(ctx,pcVar5,(ulong)(pVVar10->regVmRegisters).data[uVar9]);
              uVar9 = uVar9 + 1;
            } while (uVar9 < (pVVar10->regVmRegisters).count);
          }
        }
        pcVar5 = (pVVar10->super_VmValue).comment.begin;
        pcVar3 = (pVVar10->super_VmValue).comment.end;
        if (pcVar5 == pcVar3) {
          Print(ctx," [");
        }
        else {
          Print(ctx," (%.*s) [",(ulong)(uint)((int)pcVar3 - (int)pcVar5));
        }
        if ((pVVar10->arguments).count != 0) {
          uVar9 = 0;
          do {
            pVVar6 = (pVVar10->arguments).data[uVar9];
            if ((pVVar6 == (VmValue *)0x0) || (pVVar6->typeID != 2)) {
              pVVar6 = (VmValue *)0x0;
            }
            if ((int)uVar9 != 0) {
              Print(ctx,", ");
            }
            pcVar5 = (pVVar6->comment).begin;
            pcVar3 = (pVVar6->comment).end;
            uVar4 = (ulong)*(uint *)((long)&pVVar6[1]._vptr_VmValue + 4);
            if (pcVar5 == pcVar3) {
              Print(ctx,"%%%d",uVar4);
            }
            else {
              Print(ctx,"%%%d (%.*s)",uVar4,(ulong)(uint)((int)pcVar3 - (int)pcVar5));
            }
            uVar7 = (int)uVar9 + 2;
            uVar9 = (ulong)uVar7;
          } while (uVar7 < (pVVar10->arguments).count);
        }
        Print(ctx,"]");
      }
      else {
        if (pVVar10->color != 0) {
          Print(ctx,".c%d");
        }
        if ((pVVar10->regVmRegisters).count != 0) {
          Print(ctx,".r");
          if ((pVVar10->regVmRegisters).count != 0) {
            uVar9 = 0;
            do {
              pcVar5 = "|%d";
              if (uVar9 == 0) {
                pcVar5 = "%d";
              }
              Print(ctx,pcVar5,(ulong)(pVVar10->regVmRegisters).data[uVar9]);
              uVar9 = uVar9 + 1;
            } while (uVar9 < (pVVar10->regVmRegisters).count);
          }
        }
        pcVar5 = (pVVar10->super_VmValue).comment.begin;
        pcVar3 = (pVVar10->super_VmValue).comment.end;
        if (pcVar5 != pcVar3) {
          Print(ctx," (%.*s)",(ulong)(uint)((int)pcVar3 - (int)pcVar5));
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (block->liveIn).count);
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // live variables going out: [");
  if ((block->liveOut).count != 0) {
    uVar8 = 0;
    do {
      pVVar10 = (block->liveOut).data[uVar8];
      if (uVar8 != 0) {
        Print(ctx,", ");
      }
      Print(ctx,"%%%d",(ulong)pVVar10->uniqueId);
      if (pVVar10->color != 0) {
        Print(ctx,".c%d");
      }
      if ((pVVar10->regVmRegisters).count != 0) {
        Print(ctx,".r");
        if ((pVVar10->regVmRegisters).count != 0) {
          uVar9 = 0;
          do {
            pcVar5 = "|%d";
            if (uVar9 == 0) {
              pcVar5 = "%d";
            }
            Print(ctx,pcVar5,(ulong)(pVVar10->regVmRegisters).data[uVar9]);
            uVar9 = uVar9 + 1;
          } while (uVar9 < (pVVar10->regVmRegisters).count);
        }
      }
      pcVar5 = (pVVar10->super_VmValue).comment.begin;
      pcVar3 = (pVVar10->super_VmValue).comment.end;
      if (pcVar5 != pcVar3) {
        Print(ctx," (%.*s)",(ulong)(uint)((int)pcVar3 - (int)pcVar5));
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (block->liveOut).count);
  }
  PrintLine(ctx,"]");
  for (pVVar10 = block->firstInstruction; pVVar10 != (VmInstruction *)0x0;
      pVVar10 = pVVar10->nextSibling) {
    if ((ctx->displayAsTree != true) || ((pVVar10->super_VmValue).users.count == 0)) {
      PrintIndent(ctx);
      PrintInstruction(ctx,pVVar10);
    }
  }
  ctx->depth = ctx->depth - 1;
  OutputContext::Print(ctx->output,"\n",1);
  return;
}

Assistant:

void PrintBlock(InstructionVMGraphContext &ctx, VmBlock *block)
{
	PrintUsers(ctx, block, false);

	PrintLine(ctx, "%.*s.b%d:", FMT_ISTR(block->name), block->uniqueId);

	ctx.depth++;

	Print(ctx, "  // predecessor blocks: [");

	for(unsigned i = 0; i < block->predecessors.size(); i++)
	{
		VmBlock *predecessor = block->predecessors[i];

		if(i != 0)
			Print(ctx, ", ");

		Print(ctx, "'%.*s.b%d'", FMT_ISTR(predecessor->name), predecessor->uniqueId);
	}

	PrintLine(ctx, "]");

	Print(ctx, "  // successor blocks: [");

	for(unsigned i = 0; i < block->successors.size(); i++)
	{
		VmBlock *successor = block->successors[i];

		if(i != 0)
			Print(ctx, ", ");

		Print(ctx, "'%.*s.b%d'", FMT_ISTR(successor->name), successor->uniqueId);
	}

	PrintLine(ctx, "]");

	Print(ctx, "  // immediate dominator: [");

	if(block->idom)
		Print(ctx, "'%.*s.b%d'", FMT_ISTR(block->idom->name), block->idom->uniqueId);

	PrintLine(ctx, "]");

	Print(ctx, "  // dominance frontier: [");

	for(unsigned i = 0; i < block->dominanceFrontier.size(); i++)
	{
		VmBlock *dominator = block->dominanceFrontier[i];

		if(i != 0)
			Print(ctx, ", ");

		Print(ctx, "'%.*s.b%d'", FMT_ISTR(dominator->name), dominator->uniqueId);
	}

	PrintLine(ctx, "]");

	Print(ctx, "  // dominance children: [");

	for(unsigned i = 0; i < block->dominanceChildren.size(); i++)
	{
		VmBlock *dominator = block->dominanceChildren[i];

		if(i != 0)
			Print(ctx, ", ");

		Print(ctx, "'%.*s.b%d'", FMT_ISTR(dominator->name), dominator->uniqueId);
	}

	PrintLine(ctx, "]");

	Print(ctx, "  // live variables going in: [");

	for(unsigned i = 0; i < block->liveIn.size(); i++)
	{
		VmInstruction *liveIn = block->liveIn[i];

		if(i != 0)
			Print(ctx, ", ");

		if(liveIn->cmd == VM_INST_PHI)
		{
			Print(ctx, "%%%d", liveIn->uniqueId);

			if(liveIn->color)
				Print(ctx, ".c%d", liveIn->color);

			if(!liveIn->regVmRegisters.empty())
			{
				Print(ctx, ".r");

				for(unsigned i = 0; i < liveIn->regVmRegisters.size(); i++)
					Print(ctx, i == 0 ? "%d" : "|%d", liveIn->regVmRegisters[i]);
			}

			if(liveIn->comment.empty())
				Print(ctx, " [");
			else
				Print(ctx, " (%.*s) [", FMT_ISTR(liveIn->comment));

			for(unsigned k = 0; k < liveIn->arguments.size(); k += 2)
			{
				VmInstruction *value = getType<VmInstruction>(liveIn->arguments[k]);

				if(k != 0)
					Print(ctx, ", ");

				if(value->comment.empty())
					Print(ctx, "%%%d", value->uniqueId);
				else
					Print(ctx, "%%%d (%.*s)", value->uniqueId, FMT_ISTR(value->comment));
			}

			Print(ctx, "]");
		}
		else
		{
			Print(ctx, "%%%d", liveIn->uniqueId);

			if(liveIn->color)
				Print(ctx, ".c%d", liveIn->color);

			if(!liveIn->regVmRegisters.empty())
			{
				Print(ctx, ".r");

				for(unsigned i = 0; i < liveIn->regVmRegisters.size(); i++)
					Print(ctx, i == 0 ? "%d" : "|%d", liveIn->regVmRegisters[i]);
			}

			if(!liveIn->comment.empty())
				Print(ctx, " (%.*s)", FMT_ISTR(liveIn->comment));
		}
	}

	PrintLine(ctx, "]");

	Print(ctx, "  // live variables going out: [");

	for(unsigned i = 0; i < block->liveOut.size(); i++)
	{
		VmInstruction *liveOut = block->liveOut[i];

		if(i != 0)
			Print(ctx, ", ");

		Print(ctx, "%%%d", liveOut->uniqueId);

		if(liveOut->color)
			Print(ctx, ".c%d", liveOut->color);

		if(!liveOut->regVmRegisters.empty())
		{
			Print(ctx, ".r");

			for(unsigned i = 0; i < liveOut->regVmRegisters.size(); i++)
				Print(ctx, i == 0 ? "%d" : "|%d", liveOut->regVmRegisters[i]);
		}

		if(!liveOut->comment.empty())
			Print(ctx, " (%.*s)", FMT_ISTR(liveOut->comment));
	}

	PrintLine(ctx, "]");

	for(VmInstruction *value = block->firstInstruction; value; value = value->nextSibling)
	{
		if(ctx.displayAsTree && !value->users.empty())
			continue;

		PrintIndent(ctx);
		PrintInstruction(ctx, value);
	}

	ctx.depth--;

	PrintLine(ctx);
}